

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O0

uint64_t slang::mulTerm(uint64_t x,uint64_t y,uint64_t *carry)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 local_38;
  uint128_t p;
  uint64_t *carry_local;
  uint64_t y_local;
  uint64_t x_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = x;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = y;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *carry;
  auVar3 = auVar1 * auVar2 + auVar3;
  p._0_8_ = auVar3._8_8_;
  *carry = (uint64_t)p;
  local_38 = auVar3._0_8_;
  return local_38;
}

Assistant:

static uint64_t mulTerm(uint64_t x, uint64_t y, uint64_t& carry) {
#ifdef _MSC_VER
    uint64_t high;
    uint64_t low = _umul128(x, y, &high);
    carry = high + addcarry64(0, low, carry, &low);
    return low;
#else
    using uint128_t = unsigned __int128;
    uint128_t p = uint128_t(x) * uint128_t(y) + carry;
    carry = uint64_t(p >> 64);
    return uint64_t(p);
#endif
}